

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O2

void int_plus(IntVar *x,IntVar *y,IntVar *z)

{
  int local_74;
  IntVar *z_local;
  vec<IntVar_*> local_68;
  vec<int> local_58;
  IntVar *y_local;
  IntVar *x_local;
  
  local_58.sz = 0;
  local_58.cap = 0;
  local_58.data = (int *)0x0;
  local_68.sz = 0;
  local_68.cap = 0;
  local_68.data = (IntVar **)0x0;
  local_74 = 1;
  z_local = z;
  y_local = y;
  x_local = x;
  vec<int>::push(&local_58,&local_74);
  vec<IntVar_*>::push(&local_68,&x_local);
  local_74 = 1;
  vec<int>::push(&local_58,&local_74);
  vec<IntVar_*>::push(&local_68,&y_local);
  local_74 = -1;
  vec<int>::push(&local_58,&local_74);
  vec<IntVar_*>::push(&local_68,&z_local);
  int_linear(&local_58,&local_68,IRT_EQ,0,&bv_true);
  free(local_68.data);
  free(local_58.data);
  return;
}

Assistant:

void int_plus(IntVar* x, IntVar* y, IntVar* z) {
	vec<int> coeffs;
	vec<IntVar*> w;
	coeffs.push(1);
	w.push(x);
	coeffs.push(1);
	w.push(y);
	coeffs.push(-1);
	w.push(z);
	int_linear(coeffs, w, IRT_EQ, 0);
}